

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionGraph::make_rewind_data(InstructionGraph *this,InstructionRewind *rewind)

{
  long *plVar1;
  pointer pVVar2;
  pointer pCVar3;
  InstructionWithCode *pIVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Vec<Hpipe::Transition> *n;
  long lVar10;
  ulong uVar11;
  undefined4 extraout_var;
  pointer pVVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  Instruction *pIVar16;
  Instruction *pIVar17;
  PC *pPVar18;
  pointer pTVar19;
  long *plVar20;
  ulong uVar21;
  CodeSeqItem *csi;
  Instruction *pIVar22;
  Vec<Hpipe::InstructionRewind::CodeSeqItem> *this_00;
  InstructionRewind *pIVar23;
  pointer pCVar24;
  uint offset_beg;
  InstructionOK *ok;
  InstructionWithCode *wc;
  InstructionRewind *local_118;
  undefined1 local_10c [36];
  pointer local_e8;
  pointer local_d8;
  pointer local_c8;
  undefined1 local_c0 [72];
  pointer local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_118 = rewind;
  make_rewind_exec(this,(rewind->super_Instruction).mark,rewind);
  if (rewind->exec == (Instruction *)0x0) {
    Context::without_mark((PC *)(local_10c + 0x14),&(rewind->super_Instruction).cx);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=
              (&local_118->ncx,(PC *)(local_10c + 0x14));
    if ((pointer)local_c0._56_8_ != (pointer)0x0) {
      operator_delete((void *)local_c0._56_8_,(long)local_78 - local_c0._56_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
                 *)local_c0);
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
    if ((pointer)local_10c._20_8_ != (pointer)0x0) {
      operator_delete((void *)local_10c._20_8_,(long)local_e8 - local_10c._20_8_);
    }
  }
  else {
    local_50._M_unused._0_8_ = (undefined8)(local_10c + 4);
    local_10c._4_8_ = (Instruction *)0x0;
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:884:29)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:884:29)>
               ::_M_manager;
    Instruction::apply_rw(rewind->exec,(function<void_(Hpipe::Instruction_*)> *)&local_50,false);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    pIVar16 = (Instruction *)local_10c._4_8_;
    if (((Instruction *)local_10c._4_8_ != (Instruction *)0x0) &&
       (uVar7 = Instruction::nb_next_rw((Instruction *)local_10c._4_8_),
       uVar7 < (pIVar16 != (Instruction *)local_10c._4_8_) + 1)) {
      uVar7 = 0;
      pIVar17 = (Instruction *)0x0;
      do {
        pIVar22 = pIVar16;
        local_10c._20_8_ =
             __dynamic_cast(pIVar22,&Instruction::typeinfo,&InstructionWithCode::typeinfo);
        if ((pointer)local_10c._20_8_ != (pointer)0x0) {
          if (8 < (ulong)(*(long *)(local_10c._20_8_ + 0x10) - *(long *)(local_10c._20_8_ + 8)))
          break;
          this_00 = &local_118->code_seq_end;
          cVar6 = (**(code **)(*(CharItem **)local_10c._20_8_ + 1))(local_10c._20_8_);
          local_10c._0_4_ = 0xffffffff;
          if (cVar6 != '\0') {
            local_10c._0_4_ = uVar7;
          }
          std::
          vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
          ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>
                    ((vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                      *)this_00,(uint *)local_10c,(InstructionWithCode **)(local_10c + 0x14));
          *(undefined1 *)(local_10c._20_8_ + 0x180) = 1;
        }
        pTVar19 = (pIVar22->prev).
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)(pIVar22->prev).
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar19 != 0x28) break;
        lVar10 = __dynamic_cast(pIVar22,&Instruction::typeinfo,&InstructionNextChar::typeinfo);
        if ((lVar10 != 0) && (*(char *)(lVar10 + 0x174) == '\0')) {
          local_10c._20_8_ = local_10c._20_8_ & 0xffffffffffffff00;
          local_10c._0_4_ = local_10c._0_4_ & 0xffffff00;
          lVar14 = *(long *)(lVar10 + 0xf0);
          uVar11 = (*(long *)(lVar10 + 0xf8) - lVar14 >> 3) * -0x5555555555555555;
          uVar21 = 0;
          pPVar18 = (PC *)(local_10c + 0x14);
          bVar5 = true;
          do {
            bVar15 = bVar5;
            if (uVar21 <= uVar11 && uVar11 - uVar21 != 0) {
              plVar1 = *(long **)(lVar14 + 8 + uVar21 * 0x18);
              for (plVar20 = *(long **)(lVar14 + uVar21 * 0x18); plVar20 != plVar1;
                  plVar20 = plVar20 + 5) {
                if ((pIVar17 != (Instruction *)0x0) && ((Instruction *)*plVar20 == pIVar17)) {
                  *(undefined1 *)&pPVar18->first = 1;
                }
              }
            }
            uVar21 = 1;
            pPVar18 = (PC *)local_10c;
            bVar5 = false;
          } while (bVar15);
          if ((local_10c[0x14] != 0) && (local_10c[0] != '\0')) break;
          uVar7 = uVar7 + local_10c[0x14];
        }
        pIVar16 = pTVar19->inst;
        uVar8 = Instruction::nb_next_rw(pIVar16);
        pIVar17 = pIVar22;
      } while (uVar8 < (pIVar16 != (Instruction *)local_10c._4_8_) + 1);
    }
    pCVar24 = (local_118->code_seq_end).
              super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
              .
              super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_118->code_seq_end).
        super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
        .
        super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar24) {
      uVar7 = 1;
      uVar11 = 0;
      do {
        if (pCVar24[uVar11].offset != 0) {
          pCVar24 = pCVar24 + uVar11;
          iVar9 = (*(pCVar24->code->super_Instruction)._vptr_Instruction[0x1b])();
          if (((char)iVar9 != '\0') &&
             ((uVar7 == 1 ||
              ((local_118->code_seq_end).
               super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
               .
               super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7 - 2].offset < pCVar24->offset)))) {
            iVar9 = (*(pCVar24->code->super_Instruction)._vptr_Instruction[0x1c])
                              (pCVar24->code,&this->inst_pool);
            pCVar24->code = (InstructionWithCode *)CONCAT44(extraout_var,iVar9);
            pCVar24->offset = pCVar24->offset + -1;
          }
        }
        uVar11 = (ulong)uVar7;
        pCVar24 = (local_118->code_seq_end).
                  super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                  .
                  super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 1;
      } while (uVar11 < (ulong)((long)(local_118->code_seq_end).
                                      super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                      .
                                      super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar24 >>
                               4));
    }
    local_10c._0_4_ = 0;
    pIVar16 = local_118->exec;
    pIVar23 = local_118;
    if ((pIVar16->prev).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
        super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pIVar16->prev).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
        super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        pIVar23 = local_118;
        pVVar12 = (pIVar16->next_rw).
                  super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                  .
                  super__Vector_base<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar2 = (pIVar16->next_rw).
                 super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                 .
                 super__Vector_base<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pVVar12 == pVVar2) break;
        iVar9 = 0;
        pIVar17 = pIVar16;
        do {
          for (pTVar19 = (pVVar12->
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>).
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pTVar19 !=
              (pVVar12->super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>).
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_finish; pTVar19 = pTVar19 + 1) {
            pIVar22 = pTVar19->inst;
            if (pIVar22 != (Instruction *)0x0) {
              pIVar17 = pIVar22;
            }
            iVar9 = iVar9 + (uint)(pIVar22 != (Instruction *)0x0);
          }
          pVVar12 = pVVar12 + 1;
        } while (pVVar12 != pVVar2);
        if (iVar9 != 1) break;
        if (pIVar16 != (Instruction *)0x0) {
          local_10c._20_8_ =
               __dynamic_cast(pIVar16,&Instruction::typeinfo,&InstructionWithCode::typeinfo,0);
          if ((pointer)local_10c._20_8_ != (pointer)0x0) {
            if (*(char *)(local_10c._20_8_ + 0x180) != '\0') break;
            if (8 < (ulong)(*(long *)(local_10c._20_8_ + 0x10) - *(long *)(local_10c._20_8_ + 8))) {
              pIVar23->offset_ncx = local_10c._0_4_;
              pIVar23->need_rw = true;
              break;
            }
            cVar6 = (**(code **)(*(CharItem **)local_10c._20_8_ + 1))(local_10c._20_8_);
            local_10c._16_4_ = 0xffffffff;
            if (cVar6 != '\0') {
              local_10c._16_4_ = local_10c._0_4_;
            }
            std::
            vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
            ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>
                      ((vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                        *)&pIVar23->code_seq_beg,(uint *)(local_10c + 0x10),
                       (InstructionWithCode **)(local_10c + 0x14));
            *(undefined1 *)(local_10c._20_8_ + 0x180) = 1;
          }
          lVar10 = __dynamic_cast(pIVar16,&Instruction::typeinfo,&InstructionNextChar::typeinfo,0);
          if (((lVar10 != 0) && (*(char *)(lVar10 + 0x174) == '\0')) &&
             ((*(long **)(lVar10 + 0xf0))[1] != **(long **)(lVar10 + 0xf0))) {
            local_10c._0_4_ = local_10c._0_4_ + 1;
          }
        }
        pIVar16 = pIVar17;
        pIVar23 = local_118;
      } while ((ulong)(((long)(pIVar17->prev).
                              super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pIVar17->prev).
                              super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)
               < (ulong)(pIVar17 != local_118->exec) + 1);
    }
    local_70._8_8_ = local_10c;
    local_58 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:992:29)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:992:29)>
               ::_M_manager;
    local_70._M_unused._M_object = &local_118;
    Instruction::apply_rw(pIVar23->exec,(function<void_(Hpipe::Instruction_*)> *)&local_70,false);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    if (local_118->need_rw == true) {
      Context::without_mark((PC *)(local_10c + 0x14),&pIVar16->cx);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=
                (&local_118->ncx,(PC *)(local_10c + 0x14));
    }
    else {
      Context::without_mark((PC *)(local_10c + 0x14),&(local_118->super_Instruction).cx);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=
                (&local_118->ncx,(PC *)(local_10c + 0x14));
    }
    if ((pointer)local_c0._56_8_ != (pointer)0x0) {
      operator_delete((void *)local_c0._56_8_,(long)local_78 - local_c0._56_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
                 *)local_c0);
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
    if ((pointer)local_10c._20_8_ != (pointer)0x0) {
      operator_delete((void *)local_10c._20_8_,(long)local_e8 - local_10c._20_8_);
    }
    pCVar3 = (local_118->code_seq_beg).
             super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             .
             super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar24 = (local_118->code_seq_beg).
                   super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                   .
                   super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar24 != pCVar3;
        pCVar24 = pCVar24 + 1) {
      (*(pCVar24->code->super_Instruction)._vptr_Instruction[0x1a])
                (pCVar24->code,&(local_118->super_Instruction).running_strs);
      pIVar4 = pCVar24->code;
      if (pIVar4 != (InstructionWithCode *)0x0) {
        lVar10 = __dynamic_cast(pIVar4,&InstructionWithCode::typeinfo,&InstructionBegStr::typeinfo,0
                               );
        if (lVar10 == 0) {
          lVar10 = __dynamic_cast(pIVar4,&InstructionWithCode::typeinfo,&InstructionEndStr::typeinfo
                                  ,0);
          if (lVar10 != 0) {
            Context::rem_string(&(local_118->ncx).first,(string *)(lVar10 + 0x188));
          }
        }
        else {
          Context::add_string(&(local_118->ncx).first,(string *)(lVar10 + 0x188),
                              *(uint *)(lVar10 + 0x174));
        }
      }
    }
    if (local_118->need_rw == false) {
      uVar11 = (long)(local_118->code_seq_end).
                     super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     .
                     super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_118->code_seq_end).
                     super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     .
                     super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar21 = uVar11 & 0xffffffff0;
      if (uVar21 != 0) {
        uVar11 = uVar11 >> 4 & 0xffffffff;
        lVar10 = uVar21 - 8;
        do {
          pCVar24 = (local_118->code_seq_end).
                    super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                    .
                    super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          plVar20 = *(long **)((long)&pCVar24->offset + lVar10);
          (**(code **)(*plVar20 + 0xd0))(plVar20,&(local_118->super_Instruction).running_strs);
          lVar14 = *(long *)((long)&pCVar24->offset + lVar10);
          if (lVar14 != 0) {
            lVar13 = __dynamic_cast(lVar14,&InstructionWithCode::typeinfo,
                                    &InstructionBegStr::typeinfo,0);
            if (lVar13 == 0) {
              lVar14 = __dynamic_cast(lVar14,&InstructionWithCode::typeinfo,
                                      &InstructionEndStr::typeinfo,0);
              if (lVar14 != 0) {
                Context::rem_string(&(local_118->ncx).first,(string *)(lVar14 + 0x188));
              }
            }
            else {
              Context::add_string(&(local_118->ncx).first,(string *)(lVar13 + 0x188),
                                  *(uint *)(lVar13 + 0x174));
            }
          }
          uVar11 = uVar11 - 1;
          lVar10 = lVar10 + -0x10;
        } while (uVar11 != 0);
      }
    }
  }
  return;
}

Assistant:

void InstructionGraph::make_rewind_data( InstructionRewind *rewind ) {
    make_rewind_exec( rewind->mark, rewind );

    if ( ! rewind->exec ) {
        rewind->ncx = rewind->cx.without_mark();
        return;
    }

    // read instructions from the end (from OK instruction) until undecidabitity
    InstructionOK *ok = 0;
    unsigned offset_end = 0;
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionOK *tr = dynamic_cast<InstructionOK *>( inst ) )
            ok = tr;
    } );
    if ( ok ) {
        for( Instruction *inst = ok, *next = nullptr; ; ) {
            // if in a loop, stop here
            if ( inst->nb_next_rw() >= 1 + bool( inst != ok ) )
                break;

            // some code to register ?
            if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
                // if ambiguity, on a code, we stop here, to let the beg seq take care of it (with a rewind)
                if ( wc->cx.pos.size() >= 2 )
                    break;
                rewind->code_seq_end.emplace_back( wc->data_code() ? offset_end : -1, wc );
                wc->in_code_seq = true;
            }

            // several choices or end ?
            if ( inst->prev.size() != 1 )
                break;

            // advance
            if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
                if ( nc->beg == false ) {
                    bool in[ 2 ] = { false, false }; // in ok, in ko
                    for( unsigned nt = 0; nt < 2; ++nt ) {
                        if ( nt < nc->next_rw.size() ) {
                            for( const Transition &t : nc->next_rw[ nt ] )
                                if ( next && t.inst == next )
                                    in[ nt ] = true;
                        }
                    }
                    // if OK and KO are possible, we don't know if we have to advance or not
                    if ( in[ 0 ] && in[ 1 ] )
                        break;
                    if ( in[ 0 ] )
                        ++offset_end;
                }
            }

            // loop
            next = inst;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // replace _next instruction to non next versions if possible
    for( unsigned num_item = 0; num_item < rewind->code_seq_end.size(); ++num_item ) {
        InstructionRewind::CodeSeqItem &item = rewind->code_seq_end[ num_item ];
        if ( item.offset && item.code->works_on_next() && ( num_item == 0 || rewind->code_seq_end[ num_item - 1 ].offset < item.offset ) ) {
            item.code = item.code->no_works_on_next_clone( inst_pool );
            --item.offset;
        }
    }

    // read instructions from the beginning, until undecidability
    unsigned offset_beg = 0;
    const Context *ncx_beg = 0;
    for( Instruction *inst = rewind->exec; ; ) {
        ncx_beg = &inst->cx;

        // if in a loop, stop here
        if ( inst->prev.size() >= 1 + bool( inst != rewind->exec ) )
            break;

        // several choices / undecidability or no next
        Instruction *next_rw;
        unsigned nb_next_rw = 0;
        for( const Vec<Transition> &n : inst->next_rw ) {
            for( const Transition &t : n ) {
                if ( t.inst ) {
                    next_rw = t.inst;
                    ++nb_next_rw;
                }
            }
        }
        if ( nb_next_rw != 1 )
            break;

        // some code to register ?
        if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
            // already handled by code_seq_end
            if ( wc->in_code_seq )
                break;
            // if ambiguity, we make a rewind on wc
            if ( wc->cx.pos.size() >= 2 ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
                break;
            }
            // else, register in code_seq_beg
            rewind->code_seq_beg.emplace_back( wc->data_code() ? offset_beg : -1, wc );
            wc->in_code_seq = true;
        }

        // advance
        if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
            if ( nc->beg == false && nc->next_rw[ 0 ].size() )
                ++offset_beg;
        }

        //
        inst = next_rw;
    }

    // test if there are some instructions between code_seq_beg and code_seq_end
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionWithCode *code = dynamic_cast<InstructionWithCode *>( inst ) ) {
            if ( ! code->in_code_seq ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
            }
        }
    } );

    // restart context
    if ( rewind->need_rw )
        rewind->ncx = ncx_beg->without_mark();
    else
        rewind->ncx = rewind->cx.without_mark();

    // stuff that may change the restart context
    for( const InstructionRewind::CodeSeqItem &csi : rewind->code_seq_beg ) {
        csi.code->update_running_strings( rewind->running_strs );

        if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
            rewind->ncx.first.add_string( bs->var, bs->num_active_item );
        else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
            rewind->ncx.first.rem_string( es->var );
    }
    if ( ! rewind->need_rw ) {
        for( unsigned i = rewind->code_seq_end.size(); i--; ) {
            const InstructionRewind::CodeSeqItem &csi = rewind->code_seq_end[ i ];
            csi.code->update_running_strings( rewind->running_strs );

            if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
                rewind->ncx.first.add_string( bs->var, bs->num_active_item );
            else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
                rewind->ncx.first.rem_string( es->var );
        }

    }

    //    // add save point, remove mark if possible
    //    for( InstructionMark *mark : marks ) {
    //        // make rewind->exec, update flags for mark
    //        bool remove_mark = true;
    //        unsigned num_save = 0;
    //        for( InstructionRewind *rewind : mark->rewinds ) {
    //            if ( rewind->need_rw )
    //                remove_mark = false;
    //            else if ( rewind->code_seq.size() ) {
    //                // add save points
    //                for( InstructionWithCode *code : rewind->code_seq ) {
    //                    if ( not code->data_code() )
    //                        continue;
    //                    Instruction *orig = code->orig;
    //                    while ( orig->prev.size() == 1 and dynamic_cast<InstructionWithCode *>( orig->prev[ 0 ].inst ) )
    //                        orig = orig->prev[ 0 ].inst;
    //                    if ( orig->prev.size() == 1 and dynamic_cast<InstructionSave *>( orig->prev[ 0 ].inst ) ) {
    //                        code->save = static_cast<InstructionSave *>( orig->prev[ 0 ].inst );
    //                        continue;
    //                    }
    //                    code->save = inst_pool << new InstructionSave( orig->cx, num_save++ );
    //                    orig->insert_before_this( code->save, init );
    //                    // code->save->mark = mark;
    //                }
    //            }
    //        }
}